

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O0

void __thiscall
helics::helicsCLI11App::addTypeOption(helicsCLI11App *this,bool includeEnvironmentVariable)

{
  App *__s;
  Option *this_00;
  byte in_SIL;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RDI;
  Option *typeOption;
  App *og;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  App *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffe20;
  allocator<char> *in_stack_fffffffffffffe40;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 value;
  Option *in_stack_fffffffffffffe80;
  CoreType in_stack_fffffffffffffeac;
  string *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  App *in_stack_fffffffffffffee0;
  allocator<char> local_f1 [25];
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff38;
  App *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a1;
  Option *local_80;
  allocator<char> local_71 [56];
  allocator<char> local_39 [33];
  App *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  value = (undefined1)((ulong)local_39 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  CLI::App::add_option_group<CLI::Option_group>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  __s = CLI::App::immediate_callback(in_stack_fffffffffffffe10,(bool)in_stack_fffffffffffffe0f);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe10);
  std::allocator<char>::~allocator(local_71);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe10);
  std::allocator<char>::~allocator(local_39);
  this_01 = &local_a1;
  local_18 = __s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,in_stack_fffffffffffffe40);
  std::function<void(std::__cxx11::string_const&)>::
  function<helics::helicsCLI11App::addTypeOption(bool)::_lambda(std::__cxx11::string_const&)_1_,void>
            (in_stack_fffffffffffffe20,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffe18);
  __a = local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  CLI::App::add_option_function<std::__cxx11::string>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_RDI,in_stack_ffffffffffffff28);
  helics::core::to_string_abi_cxx11_(in_stack_fffffffffffffeac);
  std::operator+((char *)in_stack_fffffffffffffe18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10);
  std::operator+(in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10);
  CLI::Option::default_str
            ((Option *)in_stack_fffffffffffffe10,
             (string *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
  CLI::Option::ignore_case<CLI::App>(in_stack_fffffffffffffe80,(bool)value);
  this_00 = CLI::Option::ignore_underscore<CLI::App>(in_stack_fffffffffffffe80,(bool)value);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe10);
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x3a3db5);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  if ((local_9 & 1) != 0) {
    local_80 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
    CLI::Option::envname
              (this_00,(string *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe87);
  }
  return;
}

Assistant:

void addTypeOption(bool includeEnvironmentVariable = true)
    {
        auto* og = add_option_group("network type")->immediate_callback();
        auto* typeOption =
            og->add_option_function<std::string>(
                  "--coretype,-t",
                  [this](const std::string& val) {
                      coreType = coreTypeFromString(val);
                      if (coreType == CoreType::UNRECOGNIZED) {
                          throw CLI::ValidationError(val + " is NOT a recognized core type");
                      }
                  },
                  "type of the core to connect to")
                ->default_str("(" + to_string(coreType) + ")")
                ->ignore_case()
                ->ignore_underscore();
        if (includeEnvironmentVariable) {
            typeOption->envname("HELICS_CORE_TYPE");
        }
    }